

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-opt.cpp
# Opt level: O2

void ggml_opt_fit(ggml_backend_sched_t backend_sched,ggml_context *ctx_compute,ggml_tensor *inputs,
                 ggml_tensor *outputs,ggml_opt_dataset_t dataset,ggml_opt_loss_type loss_type,
                 ggml_opt_get_optimizer_params get_opt_pars,int64_t nepoch,int64_t nbatch_logical,
                 float val_split,bool silent)

{
  ggml_opt_params params;
  int64_t iVar1;
  ggml_opt_context_t opt_ctx;
  ggml_opt_result_t result;
  ggml_opt_result_t result_00;
  char *pcVar2;
  int line;
  long lVar3;
  long lVar4;
  float fVar5;
  int64_t epoch;
  ggml_opt_loss_type local_90;
  float local_8c;
  int64_t local_88;
  ggml_context *local_80;
  ggml_tensor *local_78;
  ggml_backend_sched_t local_70;
  ggml_context *pgStack_68;
  ggml_tensor *local_60;
  ggml_tensor *pgStack_58;
  ggml_opt_loss_type local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  ggml_opt_get_optimizer_params local_40;
  int64_t *piStack_38;
  
  local_90 = loss_type;
  local_8c = val_split;
  local_80 = ctx_compute;
  local_78 = outputs;
  ggml_time_init();
  iVar1 = ggml_time_us();
  lVar4 = dataset->data->ne[1];
  if (lVar4 % nbatch_logical == 0) {
    lVar3 = inputs->ne[1];
    if (nbatch_logical % lVar3 == 0) {
      if (local_8c < 0.0) {
        pcVar2 = "val_split >= 0.0f";
        line = 0x322;
      }
      else {
        local_88 = iVar1;
        if (local_8c < 1.0) {
          fVar5 = 1.0 - local_8c;
          piStack_38 = &epoch;
          epoch = 1;
          pgStack_68 = local_80;
          pgStack_58 = local_78;
          local_50 = local_90;
          uStack_4c = 2;
          uStack_48 = (undefined4)(nbatch_logical / lVar3);
          local_40 = get_opt_pars;
          params.build_type = 2;
          params.loss_type = local_90;
          params._44_4_ = uStack_44;
          params.opt_period = uStack_48;
          params.ctx_compute = local_80;
          params.backend_sched = backend_sched;
          params.inputs = inputs;
          params.outputs = local_78;
          params.get_opt_pars = get_opt_pars;
          params.get_opt_pars_ud = piStack_38;
          local_70 = backend_sched;
          local_60 = inputs;
          opt_ctx = ggml_opt_init(params);
          if (nbatch_logical < lVar4) {
            ggml_opt_dataset_shuffle(opt_ctx,dataset,-1);
          }
          lVar4 = lVar3 * (nbatch_logical / lVar3) * (long)((float)(lVar4 / nbatch_logical) * fVar5)
          ;
          result = ggml_opt_result_init();
          result_00 = ggml_opt_result_init();
          for (; epoch <= nepoch; epoch = epoch + 1) {
            if (lVar4 - nbatch_logical != 0 && nbatch_logical <= lVar4) {
              ggml_opt_dataset_shuffle(opt_ctx,dataset,lVar4);
            }
            ggml_opt_result_reset(result);
            ggml_opt_result_reset(result_00);
            if (silent) {
              ggml_opt_epoch(opt_ctx,dataset,result,result_00,lVar4,(ggml_opt_epoch_callback)0x0,
                             (ggml_opt_epoch_callback)0x0);
            }
            else {
              fprintf(_stderr,"%s: epoch %04ld/%04ld:\n","ggml_opt_fit",epoch,nepoch);
              ggml_opt_epoch(opt_ctx,dataset,result,result_00,lVar4,
                             ggml_opt_epoch_callback_progress_bar,
                             ggml_opt_epoch_callback_progress_bar);
              fputc(10,_stderr);
            }
          }
          if (!silent) {
            iVar1 = ggml_time_us();
            lVar4 = (iVar1 - local_88) / 3600000000;
            lVar3 = lVar4 * -0xe10 + (iVar1 - local_88) / 1000000;
            fprintf(_stderr,"%s: training took %02ld:%02ld:%02ld\n","ggml_opt_fit",lVar4,
                    lVar3 / 0x3c,lVar3 % 0x3c);
          }
          ggml_opt_free(opt_ctx);
          ggml_opt_result_free(result);
          ggml_opt_result_free(result_00);
          return;
        }
        pcVar2 = "val_split < 1.0f";
        line = 0x323;
      }
    }
    else {
      pcVar2 = "nbatch_logical % nbatch_physical == 0";
      line = 0x31d;
    }
  }
  else {
    pcVar2 = "ndata % nbatch_logical == 0";
    line = 0x31c;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-opt.cpp",
             line,"GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

void ggml_opt_fit(
        ggml_backend_sched_t            backend_sched,
        ggml_context                  * ctx_compute,
        ggml_tensor                   * inputs,
        ggml_tensor                   * outputs,
        ggml_opt_dataset_t              dataset,
        enum ggml_opt_loss_type         loss_type,
        ggml_opt_get_optimizer_params   get_opt_pars,
        int64_t                         nepoch,
        int64_t                         nbatch_logical,
        float                           val_split,
        bool                            silent) {
    ggml_time_init();
    const int64_t t_start_us = ggml_time_us();

    const int64_t ndata           = ggml_opt_dataset_data(dataset)->ne[1];
    const int64_t nbatch_physical = inputs->ne[1];
    GGML_ASSERT(ndata          % nbatch_logical  == 0);
    GGML_ASSERT(nbatch_logical % nbatch_physical == 0);

    const int64_t opt_period       = nbatch_logical / nbatch_physical;
    const int64_t nbatches_logical = ndata / nbatch_logical;

    GGML_ASSERT(val_split >= 0.0f);
    GGML_ASSERT(val_split <  1.0f);
    const int64_t ibatch_split = int64_t(((1.0f - val_split) * nbatches_logical)) * opt_period; // train <-> val split index (physical)
    const int64_t idata_split  = ibatch_split * nbatch_physical;

    int64_t epoch = 1;

    ggml_opt_params params = ggml_opt_default_params(backend_sched, ctx_compute, inputs, outputs, loss_type);
    params.opt_period      = opt_period;
    params.get_opt_pars    = get_opt_pars;
    params.get_opt_pars_ud = &epoch;
    ggml_opt_context_t opt_ctx = ggml_opt_init(params);

    // Shuffling the data is generally useful but there is only a point if not all data is used in a single batch.
    if (nbatch_logical < ndata) {
        ggml_opt_dataset_shuffle(opt_ctx, dataset, -1); // Shuffle all data (train + validation).
    }

    ggml_opt_result_t result_train = ggml_opt_result_init();
    ggml_opt_result_t result_val   = ggml_opt_result_init();

    ggml_opt_epoch_callback epoch_callback = silent ? nullptr : ggml_opt_epoch_callback_progress_bar;

    for (; epoch <= nepoch; ++epoch) {
        if (nbatch_logical < idata_split) {
            ggml_opt_dataset_shuffle(opt_ctx, dataset, idata_split);
        }

        ggml_opt_result_reset(result_train);
        ggml_opt_result_reset(result_val);

        if (!silent) {
            fprintf(stderr, "%s: epoch %04" PRId64 "/%04" PRId64 ":\n", __func__, epoch, nepoch);
        }
        ggml_opt_epoch(opt_ctx, dataset, result_train, result_val, idata_split, epoch_callback, epoch_callback);
        if (!silent) {
            fprintf(stderr, "\n");
        }
    }

    if (!silent) {
        int64_t t_total_s = (ggml_time_us() - t_start_us) / 1000000;
        const int64_t t_total_h = t_total_s / 3600;
        t_total_s -= t_total_h * 3600;
        const int64_t t_total_m = t_total_s / 60;
        t_total_s -= t_total_m * 60;
        fprintf(stderr, "%s: training took %02" PRId64 ":%02" PRId64 ":%02" PRId64 "\n", __func__, t_total_h, t_total_m, t_total_s);
    }

    ggml_opt_free(opt_ctx);
    ggml_opt_result_free(result_train);
    ggml_opt_result_free(result_val);
}